

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O0

SRC_STATE * zoh_state_new(int channels,SRC_ERROR *error)

{
  ZOH_DATA *pZVar1;
  SRC_STATE *state;
  SRC_ERROR *error_local;
  SRC_STATE *pSStack_10;
  int channels_local;
  
  if (channels < 1) {
    __assert_fail("channels > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_zoh.c"
                  ,0xbc,"SRC_STATE *zoh_state_new(int, SRC_ERROR *)");
  }
  if (error != (SRC_ERROR *)0x0) {
    pSStack_10 = (SRC_STATE *)calloc(1,0x50);
    if (pSStack_10 == (SRC_STATE *)0x0) {
      *error = SRC_ERR_MALLOC_FAILED;
      pSStack_10 = (SRC_STATE *)0x0;
    }
    else {
      pSStack_10->channels = channels;
      pSStack_10->mode = SRC_MODE_PROCESS;
      pZVar1 = zoh_data_new(pSStack_10->channels);
      pSStack_10->private_data = pZVar1;
      if (pSStack_10->private_data == (void *)0x0) {
        free(pSStack_10);
        *error = SRC_ERR_MALLOC_FAILED;
        pSStack_10 = (SRC_STATE *)0x0;
      }
      else {
        pSStack_10->vt = &zoh_state_vt;
        zoh_reset(pSStack_10);
        *error = SRC_ERR_NO_ERROR;
      }
    }
    return pSStack_10;
  }
  __assert_fail("error != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_zoh.c"
                ,0xbd,"SRC_STATE *zoh_state_new(int, SRC_ERROR *)");
}

Assistant:

LIBSAMPLERATE_DLL_PRIVATE SRC_STATE *
zoh_state_new (int channels, SRC_ERROR *error)
{
	assert (channels > 0) ;
	assert (error != NULL) ;

	SRC_STATE *state = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!state)
	{
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	state->channels = channels ;
	state->mode = SRC_MODE_PROCESS ;

	state->private_data = zoh_data_new (state->channels) ;
	if (!state->private_data)
	{
		free (state) ;
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	state->vt = &zoh_state_vt ;

	zoh_reset (state) ;

	*error = SRC_ERR_NO_ERROR ;

	return state ;
}